

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O1

bool __thiscall
storage::BTLeafNode::search_record(BTLeafNode *this,int key,Record **out_record,int *out_index)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = (this->super_BTNode).used_links_count_ + -2;
  iVar4 = 0;
  do {
    iVar6 = iVar4;
    iVar2 = iVar5;
    if (iVar2 < iVar6) break;
    iVar3 = (iVar2 - iVar6 >> 1) + iVar6;
    iVar1 = (this->super_BTNode).keys_[iVar3];
    iVar5 = iVar2;
    iVar4 = iVar6;
    if (iVar1 == key) {
      *out_record = this->record_links_[iVar3];
      *out_index = iVar3;
    }
    else if (key < iVar1) {
      iVar5 = iVar3 + -1;
    }
    else {
      iVar4 = iVar3 + 1;
    }
  } while (iVar1 != key);
  return iVar6 <= iVar2;
}

Assistant:

bool BTLeafNode::search_record(int key, Record *&out_record, int &out_index) {
        int L = 0, R = used_links_count_ - 2;
        while (L <= R) {
            int M = L + ((R - L) >> 1);
            if (keys_[M] == key) {
                out_record = record_links_[M];
                out_index = M;
                return true;
            } else if (keys_[M] > key) {
                R = M - 1;
            } else {
                L = M + 1;
            }
        }
        return false;
    }